

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateBreakUpvalueClose
          (ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction,ScopeData *fromScope,
          uint depth)

{
  Lexeme *allocator;
  TypeBase *type;
  FunctionData *source_00;
  ExprSequence *this;
  CloseUpvaluesData *this_00;
  ArrayView<ExprBase_*> arr;
  IntrusiveList<CloseUpvaluesData> *local_78;
  IntrusiveList<CloseUpvaluesData> *closeUpvalues;
  undefined4 local_40;
  ExprSequence *local_38;
  ExprSequence *holder;
  ScopeData *pSStack_28;
  uint depth_local;
  ScopeData *fromScope_local;
  FunctionData *onwerFunction_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  holder._4_4_ = depth;
  pSStack_28 = fromScope;
  fromScope_local = (ScopeData *)onwerFunction;
  onwerFunction_local = (FunctionData *)source;
  source_local = (SynBase *)ctx;
  this = ExpressionContext::get<ExprSequence>(ctx);
  source_00 = onwerFunction_local;
  allocator = source_local[0x229].begin;
  type = *(TypeBase **)&source_local[0x226].listed;
  ArrayView<ExprBase_*>::ArrayView((ArrayView<ExprBase_*> *)&closeUpvalues);
  arr._12_4_ = 0;
  arr.data = (ExprBase **)closeUpvalues;
  arr.count = local_40;
  ExprSequence::ExprSequence(this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
  if (fromScope_local == (ScopeData *)0x0) {
    local_78 = (IntrusiveList<CloseUpvaluesData> *)&source_local[0x206].end;
  }
  else {
    local_78 = (IntrusiveList<CloseUpvaluesData> *)&fromScope_local[1].allVariables.allocator;
  }
  local_38 = this;
  this_00 = ExpressionContext::get<CloseUpvaluesData>((ExpressionContext *)source_local);
  CloseUpvaluesData::CloseUpvaluesData
            (this_00,local_38,CLOSE_UPVALUES_BREAK,(SynBase *)onwerFunction_local,pSStack_28,
             holder._4_4_);
  IntrusiveList<CloseUpvaluesData>::push_back(local_78,this_00);
  return &local_38->super_ExprBase;
}

Assistant:

ExprBase* CreateBreakUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction, ScopeData *fromScope, unsigned depth)
{
	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	IntrusiveList<CloseUpvaluesData> &closeUpvalues = onwerFunction ? onwerFunction->closeUpvalues : ctx.globalCloseUpvalues;

	closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_BREAK, source, fromScope, depth));

	return holder;
}